

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

bool __thiscall capnp::MessageReader::isCanonical(MessageReader *this)

{
  SegmentWordCount SVar1;
  SegmentWordCount SVar2;
  ReaderArena *pRVar3;
  SegmentReader *pSVar4;
  word *location;
  ReaderOptions *pRVar5;
  bool local_81;
  undefined1 local_60 [7];
  bool allWordsConsumed;
  byte local_39;
  word *pwStack_38;
  bool rootIsCanonical;
  word *readHead;
  SegmentReader *local_28;
  SegmentReader *segment;
  MessageReader *local_18;
  MessageReader *this_local;
  
  local_18 = this;
  if ((this->allocatedArena & 1U) == 0) {
    pRVar3 = arena(this);
    segment = (SegmentReader *)this;
    kj::ctor<capnp::_::ReaderArena,capnp::MessageReader*>(pRVar3,(MessageReader **)&segment);
    this->allocatedArena = true;
  }
  pRVar3 = arena(this);
  kj::Id<unsigned_int,_capnp::_::Segment>::Id
            ((Id<unsigned_int,_capnp::_::Segment> *)((long)&readHead + 4),0);
  local_28 = _::ReaderArena::tryGetSegment(pRVar3,readHead._4_4_);
  if (local_28 == (SegmentReader *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pRVar3 = arena(this);
    kj::Id<unsigned_int,_capnp::_::Segment>::Id((Id<unsigned_int,_capnp::_::Segment> *)&readHead,1);
    pSVar4 = _::ReaderArena::tryGetSegment(pRVar3,readHead._0_4_);
    if (pSVar4 == (SegmentReader *)0x0) {
      pwStack_38 = _::SegmentReader::getStartPtr(local_28);
      pSVar4 = local_28;
      pwStack_38 = pwStack_38 + 1;
      location = _::SegmentReader::getStartPtr(local_28);
      pRVar5 = getOptions(this);
      _::PointerReader::getRoot
                ((PointerReader *)local_60,pSVar4,(CapTableReader *)0x0,location,
                 pRVar5->nestingLimit);
      local_39 = _::PointerReader::isCanonical((PointerReader *)local_60,&stack0xffffffffffffffc8);
      SVar1 = _::SegmentReader::getOffsetTo(local_28,pwStack_38);
      SVar2 = _::SegmentReader::getSize(local_28);
      local_81 = (local_39 & 1) != 0 && SVar1 == SVar2;
      this_local._7_1_ = local_81;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MessageReader::isCanonical() {
  if (!allocatedArena) {
    static_assert(sizeof(_::ReaderArena) <= sizeof(arenaSpace),
        "arenaSpace is too small to hold a ReaderArena.  Please increase it.  This will break "
        "ABI compatibility.");
    kj::ctor(*arena(), this);
    allocatedArena = true;
  }

  _::SegmentReader *segment = arena()->tryGetSegment(_::SegmentId(0));

  if (segment == NULL) {
    // The message has no segments
    return false;
  }

  if (arena()->tryGetSegment(_::SegmentId(1))) {
    // The message has more than one segment
    return false;
  }

  const word* readHead = segment->getStartPtr() + 1;
  bool rootIsCanonical = _::PointerReader::getRoot(segment, nullptr,
                                                   segment->getStartPtr(),
                                                   this->getOptions().nestingLimit)
                                                  .isCanonical(&readHead);
  bool allWordsConsumed = segment->getOffsetTo(readHead) == segment->getSize();
  return rootIsCanonical && allWordsConsumed;
}